

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDataServerCommand.cpp
# Opt level: O2

double __thiscall OpenDataServerCommand::execute(OpenDataServerCommand *this)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  uint uVar4;
  sockaddr local_48;
  undefined1 auStack_38 [8];
  sockaddr_in client_adress;
  int clientLength;
  thread data_server_thread;
  
  auStack_38._0_2_ = 0;
  auStack_38[2] = '\0';
  auStack_38[3] = '\0';
  auStack_38[4] = '\0';
  auStack_38[5] = '\0';
  auStack_38[6] = '\0';
  auStack_38[7] = '\0';
  client_adress.sin_family = 0;
  client_adress.sin_port = 0;
  client_adress.sin_addr.s_addr = 0;
  iVar1 = socket(2,1,0);
  if (iVar1 == -1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Could not create a socket");
    std::endl<char,std::char_traits<char>>(poVar3);
    uVar4 = 0xbff00000;
  }
  else {
    local_48.sa_data[6] = '\0';
    local_48.sa_data[7] = '\0';
    local_48.sa_data[8] = '\0';
    local_48.sa_data[9] = '\0';
    local_48.sa_data[10] = '\0';
    local_48.sa_data[0xb] = '\0';
    local_48.sa_data[0xc] = '\0';
    local_48.sa_data[0xd] = '\0';
    local_48.sa_family = 2;
    local_48.sa_data[2] = '\0';
    local_48.sa_data[3] = '\0';
    local_48.sa_data[4] = '\0';
    local_48.sa_data[5] = '\0';
    local_48.sa_data._0_2_ = this->port << 8 | this->port >> 8;
    iVar2 = bind(iVar1,&local_48,0x10);
    if (iVar2 == -1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Could not bind the socket to an IP");
      std::endl<char,std::char_traits<char>>(poVar3);
      uVar4 = 0xc0000000;
    }
    else {
      iVar2 = listen(iVar1,5);
      if (iVar2 == -1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error during listening command");
        std::endl<char,std::char_traits<char>>(poVar3);
        uVar4 = 0xc0080000;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"Server is now listening ...");
        std::endl<char,std::char_traits<char>>(poVar3);
        client_adress.sin_zero[4] = '\x10';
        client_adress.sin_zero[5] = '\0';
        client_adress.sin_zero[6] = '\0';
        client_adress.sin_zero[7] = '\0';
        iVar1 = accept(iVar1,(sockaddr *)auStack_38,(socklen_t *)(client_adress.sin_zero + 4));
        this->client_socket = iVar1;
        this->client_socket_pointer = &this->client_socket;
        if (iVar1 == -1) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Error accepting client");
          std::endl<char,std::char_traits<char>>(poVar3);
          uVar4 = 0xc0100000;
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,"accepted ...");
          std::endl<char,std::char_traits<char>>(poVar3);
          std::thread::thread<void*(&)(int*),int*&,void>
                    ((thread *)&stack0xffffffffffffffe0,readFromServer,&this->client_socket_pointer)
          ;
          std::thread::detach();
          std::thread::~thread((thread *)&stack0xffffffffffffffe0);
          uVar4 = 0;
        }
      }
    }
  }
  return (double)((ulong)uVar4 << 0x20);
}

Assistant:

double OpenDataServerCommand::execute() {
  //create socket
  struct sockaddr_in serv_address{}, client_adress{};
  int socketfd = socket(AF_INET, SOCK_STREAM, 0);
  if (socketfd == -1) {
    //error
    cerr << "Could not create a socket" << endl;
    return -1;
  }
  
  //bind socket to IP address
  bzero((char *) &serv_address, sizeof(serv_address));
  serv_address.sin_family = AF_INET;
  serv_address.sin_addr.s_addr =
      INADDR_ANY; //give me any IP allocated for my machine
  serv_address.sin_port = htons(this->port);
  
  //the actual bind command
  if (bind(socketfd, (struct sockaddr *) &serv_address, sizeof(serv_address))
      == -1) {
    cerr << "Could not bind the socket to an IP" << endl;
    return -2;
  }

  //making socket listen to the port
  if (listen(socketfd, 5) == -1) {
    cerr << "Error during listening command" << endl;
    return -3;
  } else {
    cout << "Server is now listening ..." << endl;
  }

  // accepting a client
  int clientLength = sizeof(client_adress);
  this->client_socket = accept(socketfd, (struct sockaddr *) &client_adress,
                               (socklen_t *) &clientLength);
  this->client_socket_pointer = &client_socket;
  if (this->client_socket == -1) {
    cerr << "Error accepting client" << endl;
    return -4;
  } else {
    cout << "accepted ..." << endl;
  }
  // create the thread
  thread data_server_thread(readFromServer, client_socket_pointer);
  data_server_thread.detach();
  return 0;
}